

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_convert_card_mtr2_to_mtr1.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  void *__ptr;
  undefined8 *__ptr_00;
  FILE *pFVar6;
  size_t sVar7;
  long lVar8;
  card_entry_mtr1_t *pcard_mtr1;
  undefined8 *puVar9;
  
  if (argc < 3) {
    printf("Usage:\n\tmm_convert_card_mtr2_to_mtr1 mm_table_%x.bin mm_table_16.bin\n",0x86);
    return -1;
  }
  puts("Nortel Millennium Credit Card Table MTR 2 to MTR1 Converter\n");
  __ptr = calloc(1,0x480);
  if (__ptr == (void *)0x0) {
    printf("Failed to allocate %zu bytes.\n",0x480);
  }
  else {
    __ptr_00 = (undefined8 *)calloc(1,0x294);
    if (__ptr_00 != (undefined8 *)0x0) {
      pFVar6 = fopen(argv[1],"rb");
      if (pFVar6 == (FILE *)0x0) {
        printf("Error opening %s\n",argv[1]);
        free(__ptr);
        free(__ptr_00);
        return -2;
      }
      iVar5 = mm_validate_table_fsize(0x86,(FILE *)pFVar6,0x480);
      if (iVar5 == 0) {
        sVar7 = fread(__ptr,0x480,1,pFVar6);
        if (sVar7 == 1) {
          lVar8 = 0;
          puVar9 = __ptr_00;
          do {
            *(undefined1 *)(puVar9 + 4) = *(undefined1 *)((long)__ptr + lVar8 + 0x20);
            uVar2 = *(undefined8 *)((long)__ptr + lVar8);
            uVar3 = ((undefined8 *)((long)__ptr + lVar8))[1];
            puVar1 = (undefined8 *)((long)__ptr + lVar8 + 0x10);
            uVar4 = puVar1[1];
            puVar9[2] = *puVar1;
            puVar9[3] = uVar4;
            *puVar9 = uVar2;
            puVar9[1] = uVar3;
            puVar9 = (undefined8 *)((long)puVar9 + 0x21);
            lVar8 = lVar8 + 0x24;
          } while (lVar8 != 0x2d0);
          pFVar6 = fopen(argv[2],"wb");
          if (pFVar6 == (FILE *)0x0) {
            printf("Error opening output file %s for write.\n",argv[2]);
            return -2;
          }
          iVar5 = 0;
          printf("\nWriting new table to %s\n",argv[2]);
          sVar7 = fwrite(__ptr_00,0x294,1,pFVar6);
          if (sVar7 != 1) {
            printf("Error writing output file %s\n",argv[2]);
            iVar5 = -5;
          }
          fclose(pFVar6);
          free(__ptr);
          free(__ptr_00);
          return iVar5;
        }
        puts("Error reading MTR 2 CCARD table.");
      }
      free(__ptr);
      free(__ptr_00);
      fclose(pFVar6);
      return -5;
    }
    printf("Failed to allocate %zu bytes.\n",0x294);
    free(__ptr);
  }
  return -0xc;
}

Assistant:

int main(int argc, char *argv[]) {
    FILE *instream;
    FILE *ostream = NULL;
    int   index;
    int   ret = 0;

    dlog_mt_card_table_t* pcard_table_mtr2;
    dlog_mt_card_table_mtr1_t *pcard_table_mtr1;

    if (argc <= 2) {
        printf("Usage:\n" \
               "\tmm_convert_card_mtr2_to_mtr1 mm_table_%x.bin mm_table_16.bin\n", TABLE_ID);
        return -1;
    }

    printf("Nortel Millennium Credit Card Table MTR 2 to MTR1 Converter\n\n");

    pcard_table_mtr2 = (dlog_mt_card_table_t*)calloc(1, sizeof(dlog_mt_card_table_t));

    if (pcard_table_mtr2 == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_card_table_t));
        return -ENOMEM;
    }

    pcard_table_mtr1 = (dlog_mt_card_table_mtr1_t*)calloc(1, sizeof(dlog_mt_card_table_mtr1_t));

    if (pcard_table_mtr1 == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_card_table_mtr1_t));
        free(pcard_table_mtr2);
        return -ENOMEM;
    }

    if ((instream = fopen(argv[1], "rb")) == NULL) {
        printf("Error opening %s\n", argv[1]);
        free(pcard_table_mtr2);
        free(pcard_table_mtr1);
        return -ENOENT;
    }

    if (mm_validate_table_fsize(TABLE_ID, instream, sizeof(dlog_mt_card_table_t)) != 0) {
        free(pcard_table_mtr2);
        free(pcard_table_mtr1);
        fclose(instream);
        return -EIO;
    }

    if (fread(pcard_table_mtr2, sizeof(dlog_mt_card_table_t), 1, instream) != 1) {
        printf("Error reading MTR 2 CCARD table.\n");
        free(pcard_table_mtr2);
        free(pcard_table_mtr1);
        fclose(instream);
        return -EIO;
    }

    for (index = 0; index < CCARD_MAX_MTR1; index++) {
        card_entry_t *pcard_mtr2 = &pcard_table_mtr2->c[index];
        card_entry_mtr1_t *pcard_mtr1 = &pcard_table_mtr1->c[index];

        /* Copy the card entry */
        memcpy(pcard_mtr1, pcard_mtr2, sizeof(card_entry_mtr1_t));
    }

    if ((ostream = fopen(argv[2], "wb")) == NULL) {
        printf("Error opening output file %s for write.\n", argv[2]);
        return -ENOENT;
    }

    printf("\nWriting new table to %s\n", argv[2]);

    if (fwrite(pcard_table_mtr1, sizeof(dlog_mt_card_table_mtr1_t), 1, ostream) != 1) {
        printf("Error writing output file %s\n", argv[2]);
        ret = -EIO;
    }

    fclose(ostream);
    free(pcard_table_mtr2);
    free(pcard_table_mtr1);

    return ret;
}